

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::FileCryptoMetaData::FileCryptoMetaData
          (FileCryptoMetaData *this,FileCryptoMetaData *other245)

{
  long in_RSI;
  TBase *in_RDI;
  EncryptionAlgorithm *other218;
  EncryptionAlgorithm *in_stack_ffffffffffffffd0;
  EncryptionAlgorithm *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__FileCryptoMetaData_00c03588;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__FileCryptoMetaData_00c03588;
  other218 = (EncryptionAlgorithm *)(in_RDI + 1);
  EncryptionAlgorithm::EncryptionAlgorithm(in_stack_ffffffffffffffd0);
  this_00 = (EncryptionAlgorithm *)(in_RDI + 0x17);
  std::__cxx11::string::string((string *)this_00);
  _FileCryptoMetaData__isset::_FileCryptoMetaData__isset
            ((_FileCryptoMetaData__isset *)(in_RDI + 0x1b));
  EncryptionAlgorithm::operator=(this_00,other218);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x17),(string *)(in_RSI + 0xb8));
  *(undefined1 *)&in_RDI[0x1b]._vptr_TBase = *(undefined1 *)(in_RSI + 0xd8);
  return;
}

Assistant:

FileCryptoMetaData::FileCryptoMetaData(const FileCryptoMetaData& other245) {
  encryption_algorithm = other245.encryption_algorithm;
  key_metadata = other245.key_metadata;
  __isset = other245.__isset;
}